

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapFilterable::initTest
          (TextureCubeMapArrayGenerateMipMapFilterable *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  size_type sVar5;
  reference pvVar6;
  StorageConfig *config;
  undefined1 local_68 [4];
  uint n_storage_config;
  StorageConfig storage_config_4;
  StorageConfig storage_config_3;
  StorageConfig storage_config_2;
  StorageConfig storage_config_1;
  Functions *gl;
  TextureCubeMapArrayGenerateMipMapFilterable *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::clear
            (&this->m_storage_configs);
  (**(code **)(lVar4 + 0xff0))(0xd05,1);
  (**(code **)(lVar4 + 0xff0))(0xcf5,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glPixelStorei() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                  ,0xcf);
  storage_config_2.m_width = 0x40;
  storage_config_2.m_to_id = 0x12;
  getAmountOfLevelsForTexture(0x40,0x40);
  storage_config_2.m_levels = 0x75;
  storage_config_3.m_width = 0x75;
  storage_config_3.m_to_id = 6;
  storage_config_2.m_height = 0;
  storage_config_2.m_depth = getAmountOfLevelsForTexture(0x75,0x75);
  storage_config_3.m_levels = 0x100;
  storage_config_4.m_width = 0x100;
  storage_config_4.m_to_id = 6;
  storage_config_3.m_height = 0;
  storage_config_3.m_depth = getAmountOfLevelsForTexture(0x100,0x100);
  storage_config_4.m_levels = 0xad;
  n_storage_config = 0xad;
  local_68 = (undefined1  [4])0xc;
  storage_config_4.m_height = 0;
  storage_config_4.m_depth = getAmountOfLevelsForTexture(0xad,0xad);
  std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::push_back
            (&this->m_storage_configs,(value_type *)&storage_config_2.m_to_id);
  std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::push_back
            (&this->m_storage_configs,(value_type *)&storage_config_3.m_to_id);
  std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::push_back
            (&this->m_storage_configs,(value_type *)&storage_config_4.m_to_id);
  std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::push_back
            (&this->m_storage_configs,(value_type *)local_68);
  config._4_4_ = 0;
  while( true ) {
    sVar5 = std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::size
                      (&this->m_storage_configs);
    if (sVar5 <= config._4_4_) break;
    pvVar6 = std::vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>::operator[]
                       (&this->m_storage_configs,(ulong)config._4_4_);
    (**(code **)(lVar4 + 0x6f8))(1,&pvVar6->m_to_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glGenTextures() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                    ,0x10b);
    (**(code **)(lVar4 + 0xb8))(0x9009,pvVar6->m_to_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindTexture() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                    ,0x10e);
    (**(code **)(lVar4 + 0x1360))(0x9009,0x2800,0x2601);
    (**(code **)(lVar4 + 0x1360))(0x9009,0x2801,0x2601);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glTexParameteri() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                    ,0x112);
    if (this->m_storage_type == ST_MUTABLE) {
      (**(code **)(lVar4 + 0x1320))
                (0x9009,0,0x8058,pvVar6->m_width,pvVar6->m_height,pvVar6->m_depth,0,0x1908,0x1401,0)
      ;
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glTexImage3D() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                      ,0x11a);
    }
    else {
      (**(code **)(lVar4 + 0x1398))
                (0x9009,pvVar6->m_levels,0x8058,pvVar6->m_width,pvVar6->m_height,pvVar6->m_depth);
      dVar2 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar2,"glTexStorage3D() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                      ,0x123);
    }
    config._4_4_ = config._4_4_ + 1;
  }
  (**(code **)(lVar4 + 0x6d0))(1,&this->m_fbo_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenFramebuffers() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                  ,0x129);
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapFilterable::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Make sure the storage config container is empty */
	m_storage_configs.clear();

	/* Update pixel pack/unpack settings */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call(s) failed");

	/* Define following texture configurations
	 *
	 *    [width x height x depth]
	 * 1)   64   x   64   x  18;
	 * 2)  117   x  117   x   6;
	 * 3)  256   x  256   x   6;
	 * 4)  173   x  173   x  12;
	 *
	 * We use GL_RGBA8 internal format in all cases.
	 */

	/* Resolution 64 x 64 x 18 */
	StorageConfig storage_config_1;

	storage_config_1.m_width  = 64;
	storage_config_1.m_height = 64;
	storage_config_1.m_depth  = 18;
	storage_config_1.m_to_id  = 0;
	storage_config_1.m_levels = getAmountOfLevelsForTexture(storage_config_1.m_width, storage_config_1.m_height);

	/* Resolution 117 x 117 x 6 */
	StorageConfig storage_config_2;

	storage_config_2.m_width  = 117;
	storage_config_2.m_height = 117;
	storage_config_2.m_depth  = 6;
	storage_config_2.m_to_id  = 0;
	storage_config_2.m_levels = getAmountOfLevelsForTexture(storage_config_2.m_width, storage_config_2.m_height);

	/* Resolution 256 x 256 x 6 */
	StorageConfig storage_config_3;

	storage_config_3.m_width  = 256;
	storage_config_3.m_height = 256;
	storage_config_3.m_depth  = 6;
	storage_config_3.m_to_id  = 0;
	storage_config_3.m_levels = getAmountOfLevelsForTexture(storage_config_3.m_width, storage_config_3.m_height);

	/* Resolution 173 x 173 x 12 */
	StorageConfig storage_config_4;

	storage_config_4.m_width  = 173;
	storage_config_4.m_height = 173;
	storage_config_4.m_depth  = 12;
	storage_config_4.m_to_id  = 0;
	storage_config_4.m_levels = getAmountOfLevelsForTexture(storage_config_4.m_width, storage_config_4.m_height);

	m_storage_configs.push_back(storage_config_1);
	m_storage_configs.push_back(storage_config_2);
	m_storage_configs.push_back(storage_config_3);
	m_storage_configs.push_back(storage_config_4);

	/* Generate and configure a texture object for each storage config. */
	for (unsigned int n_storage_config = 0; n_storage_config < m_storage_configs.size(); n_storage_config++)
	{
		StorageConfig& config = m_storage_configs[n_storage_config];

		gl.genTextures(1, &config.m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed");

		gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, config.m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call(s) failed");

		if (m_storage_type == ST_MUTABLE)
		{
			gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0,									/* level */
						  GL_RGBA8, config.m_width, config.m_height, config.m_depth, 0, /* border */
						  GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage3D() call failed");
		}
		else
		{
			DE_ASSERT(m_storage_type == ST_IMMUTABLE);

			gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, config.m_levels, GL_RGBA8, config.m_width, config.m_height,
							config.m_depth);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3D() call failed");
		}
	} /* for (all storage configs) */

	/* Generate a frame-buffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed");
}